

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_3048b2::ArgParser::argShowCrypto(ArgParser *this)

{
  bool bVar1;
  Pipeline *pPVar2;
  _Base_ptr p_Var3;
  string default_crypto;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  crypto;
  bool local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  QPDFLogger local_90;
  string local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  QPDFCryptoProvider::getRegisteredImpls_abi_cxx11_();
  QPDFCryptoProvider::getDefaultProvider_abi_cxx11_();
  QPDFLogger::defaultLogger();
  QPDFLogger::getInfo(&local_90,local_a0);
  pPVar2 = Pipeline::operator<<
                     ((Pipeline *)
                      local_90.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,&local_80);
  Pipeline::operator<<(pPVar2,"\n");
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_90.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
  for (p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &local_60._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (p_Var3 + 1),&local_80);
    if (bVar1) {
      QPDFLogger::defaultLogger();
      QPDFLogger::getInfo(&local_90,local_a0);
      pPVar2 = Pipeline::operator<<
                         ((Pipeline *)
                          local_90.m.
                          super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          ,(string *)(p_Var3 + 1));
      Pipeline::operator<<(pPVar2,"\n");
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_90.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
    }
  }
  std::__cxx11::string::~string((string *)&local_80);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void
ArgParser::argShowCrypto()
{
    auto crypto = QPDFCryptoProvider::getRegisteredImpls();
    std::string default_crypto = QPDFCryptoProvider::getDefaultProvider();
    *QPDFLogger::defaultLogger()->getInfo() << default_crypto << "\n";
    for (auto const& iter: crypto) {
        if (iter != default_crypto) {
            *QPDFLogger::defaultLogger()->getInfo() << iter << "\n";
        }
    }
}